

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::ReporterRegistrar<Catch::CompactReporter>::ReporterRegistrar
          (ReporterRegistrar<Catch::CompactReporter> *this,string *name)

{
  IMutableRegistryHub *pIVar1;
  Ptr<Catch::IReporterFactory> local_18;
  
  pIVar1 = getMutableRegistryHub();
  local_18.m_p = (IReporterFactory *)operator_new(0x10);
  ((local_18.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable = (_func_int **)0x0;
  local_18.m_p[1].super_IShared.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x0;
  ((local_18.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable =
       (_func_int **)&PTR__IReporter_0016ad30;
  *(undefined4 *)&local_18.m_p[1].super_IShared.super_NonCopyable._vptr_NonCopyable = 1;
  (*pIVar1->_vptr_IMutableRegistryHub[2])(pIVar1,name);
  Ptr<Catch::IReporterFactory>::~Ptr(&local_18);
  return;
}

Assistant:

ReporterRegistrar( std::string const& name ) {
            getMutableRegistryHub().registerReporter( name, new ReporterFactory() );
        }